

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O0

string * __thiscall cppcms::http::file::mime_abi_cxx11_(file *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x20));
  return in_RDI;
}

Assistant:

std::string file::mime() const
{
	return mime_;
}